

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall SVGChart::PPlot::Draw(PPlot *this,Painter *inPainter)

{
  PDrawer *pPVar1;
  PCalculator *pPVar2;
  char cVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar7;
  bool bVar8;
  pointer ppPVar9;
  pointer ppPVar10;
  PRect theRect;
  ulong local_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  AxisSetup *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_78 = 0;
  uStack_70 = 0;
  local_88 = (this->mMargins).mLeft;
  uStack_80 = (this->mMargins).mTop;
  iVar4 = (*inPainter->_vptr_Painter[4])(inPainter);
  local_78 = CONCAT44(extraout_var,iVar4) - ((this->mMargins).mLeft + (this->mMargins).mRight);
  iVar4 = (*inPainter->_vptr_Painter[5])(inPainter);
  uStack_70 = CONCAT44(extraout_var_00,iVar4) - ((this->mMargins).mTop + (this->mMargins).mBottom);
  pPVar1 = this->mPPlotDrawer;
  if (pPVar1 != (PDrawer *)0x0) {
    (*pPVar1->_vptr_PDrawer[2])(pPVar1,inPainter,this);
    iVar4 = (*this->mPPlotDrawer->_vptr_PDrawer[3])(this->mPPlotDrawer,inPainter);
    return SUB41(iVar4,0);
  }
  if ((int)((ulong)((long)(this->mPlotDataContainer).mYDataList.
                          super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->mPlotDataContainer).mYDataList.
                         super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) == 0) {
    bVar8 = true;
  }
  else {
    iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x10])(this);
    if (((char)iVar4 != '\0') &&
       (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x11])(this), (char)iVar4 != '\0')) {
      local_60 = &this->mYAxisSetup;
      bVar8 = false;
LAB_00105d55:
      iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x12])(this);
      if ((((((char)iVar4 != '\0') &&
            (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x13])(this,&this->mXAxisSetup),
            (char)iVar4 != '\0')) &&
           (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x13])(this,local_60), (char)iVar4 != '\0'
           )) && ((iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[10])(this,&local_88,inPainter),
                  (char)iVar4 != '\0' &&
                  (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[4])(this,&local_88),
                  (char)iVar4 != '\0')))) &&
         (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[5])(this,&local_88), (char)iVar4 != '\0')) {
        if (!bVar8) goto code_r0x00105dde;
        for (ppPVar9 = (this->mPostCalculatorList).
                       super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppPVar9 !=
            (this->mPostCalculatorList).
            super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>.
            _M_impl.super__Vector_impl_data._M_finish; ppPVar9 = ppPVar9 + 1) {
          (**(code **)(*(long *)*ppPVar9 + 0x18))(*ppPVar9,inPainter,this);
        }
        for (ppPVar10 = (this->mPreDrawerList).
                        super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppPVar10 !=
            (this->mPreDrawerList).
            super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppPVar10 = ppPVar10 + 1) {
          (*(*ppPVar10)->_vptr_PDrawer[2])(*ppPVar10,inPainter,this);
        }
        (*inPainter->_vptr_Painter[6])(inPainter,0,0,0);
        uVar5 = (*inPainter->_vptr_Painter[4])(inPainter);
        uVar6 = (*inPainter->_vptr_Painter[5])(inPainter);
        (*inPainter->_vptr_Painter[3])(inPainter,0,0,(ulong)uVar5,(ulong)uVar6);
        local_48 = 0;
        uStack_40 = 0;
        local_58 = 0;
        uStack_50 = 0;
        iVar4 = (*inPainter->_vptr_Painter[4])(inPainter);
        local_48 = CONCAT44(extraout_var_01,iVar4);
        iVar4 = (*inPainter->_vptr_Painter[5])(inPainter);
        uStack_40 = CONCAT44(extraout_var_02,iVar4);
        iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xb])(this,&local_58,inPainter);
        if ((char)iVar4 == '\0') {
          return false;
        }
        for (ppPVar10 = (this->mPreDrawerList).
                        super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            ppPVar10 !=
            (this->mPreDrawerList).
            super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppPVar10 = ppPVar10 + 1) {
          (*(*ppPVar10)->_vptr_PDrawer[3])(*ppPVar10,inPainter);
        }
        iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[6])(this,&local_88,inPainter);
        if ((((char)iVar4 != '\0') &&
            (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[7])(this,&local_88,inPainter),
            (char)iVar4 != '\0')) &&
           ((iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[8])(this,&local_88,inPainter),
            (char)iVar4 != '\0' &&
            ((iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[9])(this,&local_88,inPainter),
             (char)iVar4 != '\0' &&
             (iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xe])(this,&local_88,inPainter),
             (char)iVar4 != '\0')))))) {
          (*inPainter->_vptr_Painter[3])
                    (inPainter,local_88 & 0xffffffff,uStack_80 & 0xffffffff,local_78 & 0xffffffff,
                     uStack_70 & 0xffffffff);
          if ((int)((ulong)((long)(this->mPlotDataContainer).mYDataList.
                                  super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->mPlotDataContainer).mYDataList.
                                 super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) < 1) {
LAB_00105ff0:
            for (ppPVar10 = (this->mPostDrawerList).
                            super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                ppPVar10 !=
                (this->mPostDrawerList).
                super__Vector_base<SVGChart::PDrawer_*,_std::allocator<SVGChart::PDrawer_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppPVar10 = ppPVar10 + 1) {
              (*(*ppPVar10)->_vptr_PDrawer[3])(*ppPVar10,inPainter);
            }
            return true;
          }
          uVar7 = 0;
          while( true ) {
            iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0xf])(this,uVar7,&local_88,inPainter);
            if ((char)iVar4 == '\0') break;
            uVar5 = (int)uVar7 + 1;
            uVar7 = (ulong)uVar5;
            if ((int)((ulong)((long)(this->mPlotDataContainer).mYDataList.
                                    super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->mPlotDataContainer).mYDataList.
                                   super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) <= (int)uVar5)
            goto LAB_00105ff0;
          }
        }
      }
    }
    bVar8 = false;
  }
  return bVar8;
code_r0x00105dde:
  for (ppPVar9 = (this->mModifyingCalculatorList).
                 super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppPVar9 !=
      (this->mModifyingCalculatorList).
      super__Vector_base<SVGChart::PCalculator_*,_std::allocator<SVGChart::PCalculator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppPVar9 = ppPVar9 + 1) {
    pPVar2 = *ppPVar9;
    cVar3 = (**(code **)(*(long *)pPVar2 + 0x10))(pPVar2);
    if (cVar3 != '\0') {
      (**(code **)(*(long *)pPVar2 + 0x18))(pPVar2,inPainter,this);
      this->mHasAnyModifyingCalculatorBeenActive = true;
    }
  }
  iVar4 = (*(this->super_PDrawer)._vptr_PDrawer[0x11])(this);
  bVar8 = true;
  if ((char)iVar4 == '\0') {
    return false;
  }
  goto LAB_00105d55;
}

Assistant:

bool PPlot::Draw (Painter &inPainter) {
      PRect theRect;
      theRect.mX = mMargins.mLeft;
      theRect.mY = mMargins.mTop;
      theRect.mW = inPainter.GetWidth () - mMargins.mLeft - mMargins.mRight;
      theRect.mH = inPainter.GetHeight () - mMargins.mTop - mMargins.mBottom;

      if (mPPlotDrawer) {
        mPPlotDrawer->Prepare (inPainter, *this);
        return mPPlotDrawer->Draw (inPainter);
      }
      if (!mPlotDataContainer.GetPlotCount ()) {
        return true;
      }

      if (!ConfigureSelf ()) {
        return false;
      }
      bool theShouldRepeat = true;
      long theRepeatCount = 0;

      while (theShouldRepeat && theRepeatCount<2) {
        theRepeatCount++;

        if (!ValidateData ()) {
          return false;
        }

        if (!CalculateAxisRanges ()) {
          return false;
        }

        if (!this->CheckRange (mXAxisSetup)) {
          return false;
        }

        if (!this->CheckRange (mYAxisSetup)) {
          return false;
        }

        if (!CalculateTickInfo (theRect, inPainter)) {
          return false;
        }

        if (!CalculateXTransformation (theRect)) {
          return false;
        }

        if (!CalculateYTransformation (theRect)) {
          return false;
        }
        if (theRepeatCount>1) {
          break;
        }
        // hooks for some final calculations
        //bool theShouldRepeat = false;
        for (PCalculator::tList::iterator theModifyingC=mModifyingCalculatorList.begin ();theModifyingC!=mModifyingCalculatorList.end();theModifyingC++) {
          PCalculator *theModifyingCalculator = *theModifyingC;
          if (theModifyingCalculator->ShouldCalculate ()) {
            //theShouldRepeat = true;
            theModifyingCalculator->Calculate (inPainter, *this);
            mHasAnyModifyingCalculatorBeenActive = true;
          }
        }
    //    theShouldRepeat = mModifyingCalculatorList.size ()>0;
      }

      // hooks for some final calculations
      for (PCalculator::tList::iterator thePostC=mPostCalculatorList.begin ();thePostC!=mPostCalculatorList.end();thePostC++) {
        PCalculator *thePostCalculator = *thePostC;
        thePostCalculator->Calculate (inPainter, *this);
      }

      for (PDrawer::tList::iterator thePre1=mPreDrawerList.begin();thePre1!=mPreDrawerList.end ();thePre1++) {
        PDrawer *thePreDrawer = *thePre1;
        thePreDrawer->Prepare (inPainter, *this);
      }

      // Drawing !

      inPainter.SetLineColor (0,0,0);
      inPainter.SetClipRect (0, 0, inPainter.GetWidth (), inPainter.GetHeight ());

      // draw entire background, including the margins (for scrolling...)
      PRect fullRect;
      fullRect.mX = 0;
      fullRect.mY = 0;
      fullRect.mW = inPainter.GetWidth ();
      fullRect.mH = inPainter.GetHeight ();
      if (!DrawPlotBackground (fullRect, inPainter)) {
        return false;
      }

      for (PDrawer::tList::iterator thePre=mPreDrawerList.begin ();thePre!=mPreDrawerList.end();thePre++) {
        PDrawer *thePreDrawer = *thePre;
        thePreDrawer->Draw (inPainter);
      }


      if (!DrawGridXAxis (theRect, inPainter)) {
        return false;
      }
      
      if (!DrawGridYAxis (theRect, inPainter)) {
        return false;
      }
      
      if (!DrawXAxis (theRect, inPainter)) {
        return false;
      }

      if (!DrawYAxis (theRect, inPainter)) {
        return false;
      }

      if (!DrawLegend (theRect, inPainter)) {
        return false;
      }

      // clip the plotregion while drawing plots
      inPainter.SetClipRect (theRect.mX, theRect.mY, theRect.mW, theRect.mH);


      for (int theI=0;theI<mPlotDataContainer.GetPlotCount ();theI++) {
        if (!DrawPlot (theI, theRect, inPainter)) {
          return false;
        }
      }

      for (PDrawer::tList::iterator thePost=mPostDrawerList.begin ();thePost!=mPostDrawerList.end();thePost++) {
        PDrawer *thePostDrawer = *thePost;
        thePostDrawer->Draw (inPainter);
      }

      return true;
    }